

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O2

void __thiscall
jsoncons::cbor::
basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
::write_utf8_string(basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
                    *this,string_view *sv)

{
  bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *d_first;
  ulong val;
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  byte val_00;
  
  val = sv->_M_len;
  val_00 = (byte)val;
  if (val < 0x18) {
    val_00 = val_00 | 0x60;
  }
  else {
    if (0xff < val) {
      if (val < 0x10000) {
        binary::
        native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
                  ('y',(back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        )&this->sink_);
        binary::
        native_to_big<unsigned_short,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
                  ((unsigned_short)val,
                   (back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                    )&this->sink_);
      }
      else {
        d_first = &this->sink_;
        if (val >> 0x20 == 0) {
          binary::
          native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
                    ('z',(back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          )d_first);
          binary::
          native_to_big<unsigned_int,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
                    ((uint)val,
                     (back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                      )d_first);
        }
        else {
          binary::
          native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
                    ('{',(back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          )d_first);
          binary::
          native_to_big<unsigned_long,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
                    (val,(back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          )d_first);
        }
      }
      goto LAB_001fb8a5;
    }
    binary::
    native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
              ('x',(back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                    )&this->sink_);
  }
  binary::
  native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
            (val_00,(back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                     )&this->sink_);
LAB_001fb8a5:
  sVar1 = sv->_M_len;
  pcVar2 = sv->_M_str;
  for (sVar3 = 0; sVar1 != sVar3; sVar3 = sVar3 + 1) {
    bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>::push_back
              (&this->sink_,pcVar2[sVar3]);
  }
  return;
}

Assistant:

void write_utf8_string(const string_view& sv)
    {
        const size_t length = sv.size();

        if (length <= 0x17)
        {
            // fixstr stores a byte array whose length is upto 31 bytes
            binary::native_to_big(static_cast<uint8_t>(0x60 + length), 
                                            std::back_inserter(sink_));
        }
        else if (length <= 0xff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x78), 
                                            std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint8_t>(length), 
                                            std::back_inserter(sink_));
        }
        else if (length <= 0xffff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x79), 
                                            std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint16_t>(length), 
                                            std::back_inserter(sink_));
        }
        else if (length <= 0xffffffff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x7a), 
                                            std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint32_t>(length), 
                                            std::back_inserter(sink_));
        }
        else if (uint64_t(length) <= (std::numeric_limits<std::uint64_t>::max)())
        {
            binary::native_to_big(static_cast<uint8_t>(0x7b), 
                                            std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint64_t>(length), 
                                            std::back_inserter(sink_));
        }

        for (auto c : sv)
        {
            sink_.push_back(c);
        }
    }